

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int ffbinre(char **ptr,char *colname,char **exprbeg,char **exprend,double *minin,double *maxin,
           double *binsizein,char *minname,char *maxname,char *binname,int *status)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  char *pcVar6;
  double dVar7;
  char *token;
  char *local_48;
  int local_3c;
  char *local_38;
  
  local_3c = 0;
  local_48 = (char *)0x0;
  if (0 < *status) {
    return *status;
  }
  iVar2 = fits_get_token2(ptr," ,=:;(",&local_48,&local_3c,status);
  if (*status != 0) {
    return *status;
  }
  pbVar5 = (byte *)*ptr;
  if (((iVar2 == 0) && ((ulong)*pbVar5 < 0x3c)) &&
     ((0x800100000000001U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
    return 0;
  }
  if (local_3c == 0) {
    bVar1 = *pbVar5;
    if (bVar1 != 0x3a) {
      if (local_48 != (char *)0x0) {
        local_38 = local_48;
        sVar3 = strlen(local_48);
        if (0x46 < sVar3) {
          pcVar6 = "column name too long (ffbinr)";
          goto LAB_001bfd53;
        }
        pcVar6 = local_38;
        if ((*local_38 == '#') &&
           (ppuVar4 = __ctype_b_loc(), pcVar6 = local_38,
           (*(byte *)((long)*ppuVar4 + (long)local_38[1] * 2 + 1) & 8) != 0)) {
          pcVar6 = local_38 + 1;
        }
        strcpy(colname,pcVar6);
        free(local_38);
        local_48 = (char *)0x0;
        pbVar5 = (byte *)*ptr;
        bVar1 = *pbVar5;
      }
      while (bVar1 == 0x20) {
        pbVar5 = pbVar5 + 1;
        *ptr = (char *)pbVar5;
        bVar1 = *pbVar5;
      }
      if (exprend == (char **)0x0) goto LAB_001bfe08;
      if (exprbeg == (char **)0x0) goto LAB_001bfe08;
      if (bVar1 != 0x28) goto LAB_001bfe08;
      *exprbeg = (char *)pbVar5;
      pbVar5 = (byte *)fits_find_match_delim(*ptr + 1,')');
      *exprend = (char *)pbVar5;
      if (pbVar5 == (byte *)0x0) {
        ffpmsg("bin expression syntax error (ffbinr)");
        *status = 0x1af;
        return 0x1af;
      }
      while( true ) {
        *ptr = (char *)pbVar5;
LAB_001bfe08:
        if (*pbVar5 != 0x20) break;
        pbVar5 = pbVar5 + 1;
      }
      if (*pbVar5 != 0x3d) {
        return *status;
      }
      do {
        pbVar5 = pbVar5 + 1;
        *ptr = (char *)pbVar5;
      } while (*pbVar5 == 0x20);
      iVar2 = fits_get_token2(ptr," ,:;",&local_48,&local_3c,status);
      if (*status != 0) {
        return *status;
      }
      pbVar5 = (byte *)*ptr;
      goto LAB_001bfaeb;
    }
LAB_001bfb44:
    pcVar6 = local_48;
    if (iVar2 != 0) {
      if (local_3c == 0) {
        sVar3 = strlen(local_48);
        if (0x46 < sVar3) {
          pcVar6 = "minname too long (ffbinr)";
          goto LAB_001bfd53;
        }
        strcpy(minname,pcVar6);
      }
      else {
        dVar7 = strtod(local_48,(char **)0x0);
        *minin = dVar7;
        pcVar6 = local_48;
      }
      free(pcVar6);
      local_48 = (char *)0x0;
      pbVar5 = (byte *)*ptr;
    }
    *ptr = (char *)(pbVar5 + 1);
    iVar2 = fits_get_token2(ptr," ,:;",&local_48,&local_3c,status);
    pcVar6 = local_48;
    if (*status != 0) {
      return *status;
    }
    if (iVar2 != 0) {
      if (local_3c == 0) {
        sVar3 = strlen(local_48);
        if (0x46 < sVar3) {
          pcVar6 = "maxname too long (ffbinr)";
          goto LAB_001bfd53;
        }
        strcpy(maxname,pcVar6);
      }
      else {
        dVar7 = strtod(local_48,(char **)0x0);
        *maxin = dVar7;
        pcVar6 = local_48;
      }
      free(pcVar6);
      local_48 = (char *)0x0;
    }
    if (**ptr != ':') {
      free(local_48);
      return *status;
    }
    *ptr = *ptr + 1;
    iVar2 = fits_get_token2(ptr," ,:;",&local_48,&local_3c,status);
    if (*status != 0) {
      return *status;
    }
    pcVar6 = local_48;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
LAB_001bfaeb:
    if (*pbVar5 == 0x3a) goto LAB_001bfb44;
    pcVar6 = local_48;
    if (local_48 == (char *)0x0) {
      return 0;
    }
  }
  local_48 = pcVar6;
  if (local_3c == 0) {
    sVar3 = strlen(pcVar6);
    if (0x46 < sVar3) {
      pcVar6 = "binname too long (ffbinr)";
LAB_001bfd53:
      ffpmsg(pcVar6);
      free(local_48);
      *status = 0x1af;
      return 0x1af;
    }
    strcpy(binname,pcVar6);
  }
  else {
    dVar7 = strtod(pcVar6,(char **)0x0);
    *binsizein = dVar7;
    pcVar6 = local_48;
  }
  free(pcVar6);
  return *status;
}

Assistant:

int ffbinre(char **ptr, 
	    char *colname, 
	    char **exprbeg, char **exprend,
	    double *minin,
	    double *maxin, 
	    double *binsizein,
	    char *minname,
	    char *maxname,
	    char *binname,
	    int *status)
/*
   Parse the input binning range specification string, returning 
   the column name, histogram min and max values, and bin size.

   This is the "extended" binning syntax that allows for an expression
   of the form XCOL(expr).  The expression must be enclosed in parentheses.

   The start and end of the expression are returned in *exprbeg and *exprend.
   If exprbeg and exprend are null pointers then the expression is forbidden.
*/
{
    int slen, isanumber=0;
    char *token=0;

    if (*status > 0)
        return(*status);

    slen = fits_get_token2(ptr, " ,=:;(", &token, &isanumber, status); /* get 1st token */

    if ((*status) || (slen == 0 && (**ptr == '\0' || **ptr == ',' || **ptr == ';')) )
        return(*status);   /* a null range string */
        
    if (!isanumber && **ptr != ':')
    {
        /* this looks like the column name */
        
        /* Check for case where col name string is empty but '='
           is still there (indicating a following specification string).
           Musn't enter this block as token would not have been allocated. */
        if (token)
        {
           if (strlen(token) > FLEN_VALUE-1)
           {
              ffpmsg("column name too long (ffbinr)");
              free(token);
              return(*status=PARSE_SYNTAX_ERR);
           }
           if (token[0] == '#' && isdigit((int) token[1]) )
           {
               /* omit the leading '#' in the column number */
               strcpy(colname, token+1);
           }
           else
               strcpy(colname, token);
           free(token);
           token=0;
        }
        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

	/* An optional expression of the form XCOL(expr) is allowed here, but only 
	   if exprbeg and exprend are non-null */
	if (**ptr == '(' && exprbeg && exprend) {
	  *exprbeg = *ptr;
	  if ((*exprend = fits_find_match_delim(*ptr+1,')')) == 0) { /* find ')' */
              ffpmsg("bin expression syntax error (ffbinr)");
              return(*status=PARSE_SYNTAX_ERR);
	  }
	  *ptr = *exprend; /* Advance pointer past delimeter */
	}
        while (**ptr == ' ')  (*ptr)++; /* skip over more possible blanks */
	
        if (**ptr != '=')
            return(*status);  /* reached the end */
            
        (*ptr)++;   /* skip over the = sign */

        while (**ptr == ' ')  /* skip over blanks */
             (*ptr)++;

        /* get specification info */
        slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status);
        if (*status)
           return(*status);
    }

    if (**ptr != ':')
    {
        /* This is the first token, and since it is not followed by 
         a ':' this must be the binsize token. Or it could be empty. */
        if (token)
        {
           if (!isanumber)
           {
               if (strlen(token) > FLEN_VALUE-1)
               {
                  ffpmsg("binname too long (ffbinr)");
                  free(token);
                  return(*status=PARSE_SYNTAX_ERR);
               }
               strcpy(binname, token);
           }
           else
               *binsizein =  strtod(token, NULL);

           free(token);
        }
           
        return(*status);  /* reached the end */
    }
    else
    {
        /* the token contains the min value */
        if (slen)
        {
            if (!isanumber)
            {
                if (strlen(token) > FLEN_VALUE-1)
                {
                   ffpmsg("minname too long (ffbinr)");
                   free(token);
                   return(*status=PARSE_SYNTAX_ERR);
                }
                strcpy(minname, token);
            }
            else
                *minin = strtod(token, NULL);
            free(token);
            token=0;
        }
    }

    (*ptr)++;  /* skip the colon between the min and max values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the max value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("maxname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(maxname, token);
        }
        else
            *maxin = strtod(token, NULL);
        free(token);
        token=0;
    }

    if (**ptr != ':')
    {
        free(token);
        return(*status);  /* reached the end; no binsize token */
    }

    (*ptr)++;  /* skip the colon between the max and binsize values */
    slen = fits_get_token2(ptr, " ,:;", &token, &isanumber, status); /* get token */
    if (*status)
       return(*status);

    /* the token contains the binsize value */
    if (slen)
    {
        if (!isanumber)
        {
            if (strlen(token) > FLEN_VALUE-1)
            {
               ffpmsg("binname too long (ffbinr)");
               free(token);
               return(*status=PARSE_SYNTAX_ERR);
            }
            strcpy(binname, token);
        }
        else
            *binsizein = strtod(token, NULL);
        free(token);
    }

    return(*status);
}